

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O2

bool test_Player_Constructor(void)

{
  vector<CardType,_std::allocator<CardType>_> *pvVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this;
  Hand *this_00;
  DiceRoller *this_01;
  Player *this_02;
  bool bVar2;
  Deck deck;
  Country *pCountry3;
  Country *pCountry2;
  Country *pCountry1;
  string local_110;
  string local_f0;
  string local_d0;
  Country country3;
  Country country2;
  Country country1;
  
  this = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (this->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"country1",(allocator<char> *)&country2);
  Map::Country::Country(&country1,0,&local_d0,0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"country2",(allocator<char> *)&country3);
  Map::Country::Country(&country2,1,&local_f0,0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"country3",(allocator<char> *)&deck);
  Map::Country::Country(&country3,3,&local_110,1);
  std::__cxx11::string::~string((string *)&local_110);
  pCountry3 = &country3;
  pCountry2 = &country2;
  pCountry1 = &country1;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back(this,&pCountry1);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back(this,&pCountry2);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back(this,&pCountry3);
  this_00 = (Hand *)operator_new(8);
  Hand::Hand(this_00);
  Deck::Deck(&deck,3);
  Deck::createDeck(&deck);
  Deck::draw(&deck,this_00);
  this_01 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_01);
  this_02 = (Player *)operator_new(0x38);
  Player::Player(this_02,this,this_00,this_01,1);
  if ((((this_02->pOwnedCountries->
        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (this_02->pOwnedCountries->
        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) ||
      (pvVar1 = this_02->pCards->handPointer,
      (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish)) || (bVar2 = true, *this_02->pPlayerId != 1)) {
    bVar2 = false;
  }
  Player::~Player(this_02);
  operator_delete(this_02,0x38);
  Deck::~Deck(&deck);
  Map::Country::~Country(&country3);
  Map::Country::~Country(&country2);
  Map::Country::~Country(&country1);
  return bVar2;
}

Assistant:

bool test_Player_Constructor() {

    // Arrange
    auto* ownedCountries1 = new std::vector<Map::Country*>();
    Map::Country country1 = Map::Country(0, "country1", 0);
    Map::Country country2 = Map::Country(1, "country2", 0);
    Map::Country country3 = Map::Country(3, "country3", 1);
    Map::Country* pCountry1 = &country1;
    Map::Country* pCountry2 = &country2;
    Map::Country* pCountry3 = &country3;
    ownedCountries1->push_back(pCountry1);
    ownedCountries1->push_back(pCountry2);
    ownedCountries1->push_back(pCountry3);
    auto* cards = new Hand();
    Deck deck = Deck(3);
    deck.createDeck();
    deck.draw(*cards);
    auto* diceRoller = new DiceRoller();
    const int playerId = 1;
    bool success = true;

    // Act
    auto* player1 = new Player(ownedCountries1, cards, diceRoller, playerId);

    // Assert
    if (player1->getOwnedCountries()->empty() || player1->getCards()->getHand()->empty() ||
        playerId != player1->getPlayerId()) {
        success = false;
    }

    delete player1;
    return success;
}